

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_image.cpp
# Opt level: O0

void __thiscall Am_Image_Array::Get_Size(Am_Image_Array *this,int *ret_width,int *ret_height)

{
  bool bVar1;
  ushort local_24;
  ushort local_22;
  unsigned_short h;
  uint *puStack_20;
  unsigned_short w;
  int *ret_height_local;
  int *ret_width_local;
  Am_Image_Array *this_local;
  
  *ret_height = 0;
  *ret_width = 0;
  if ((this->data != (Am_Image_Array_Data *)0x0) &&
     ((puStack_20 = (uint *)ret_height, ret_height_local = ret_width, ret_width_local = (int *)this,
      this->data->image_ != (Am_Generic_Image *)0x0 ||
      (bVar1 = Am_Image_Array_Data::make_generic_image_from_name(this->data), bVar1)))) {
    Am_Generic_Image::Get_Size(this->data->image_,&local_22,&local_24);
    *ret_height_local = (uint)local_22;
    *puStack_20 = (uint)local_24;
  }
  return;
}

Assistant:

void
Am_Image_Array::Get_Size(int &ret_width, int &ret_height) const
{
  ret_width = ret_height = 0;
  if (data) {
    if (data->image_ == nullptr) {
      if (!data->make_generic_image_from_name())
        return;
    }
    short unsigned int w, h; // using temps explicitly gets rid of a warning
    data->image_->Get_Size(w, h);
    ret_width = w;
    ret_height = h;
  }
}